

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Teleport.cpp
# Opt level: O1

int Teleport::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  
  pfVar2 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar2 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,"T *UnityAudioEffectState::GetEffectData() const [T = Teleport::EffectData]"
                 );
  }
  if ((state->field_0).field_0.internal == (void *)0x0) {
    __assert_fail("internal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = Teleport::EffectData]"
                 );
  }
  iVar1 = 1;
  if (index < 8) {
    if (index < 4) {
      pfVar2 = pfVar2 + index;
    }
    else {
      uVar3 = (uint)*pfVar2;
      if ((int)uVar3 < 0) {
        __assert_fail("stream >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                      ,0x66,
                      "int Teleport::SetFloatParameterCallback(UnityAudioEffectState *, int, float)"
                     );
      }
      if (7 < (int)uVar3) {
        __assert_fail("stream < Teleport::NUMSTREAMS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                      ,0x67,
                      "int Teleport::SetFloatParameterCallback(UnityAudioEffectState *, int, float)"
                     );
      }
      if (GetSharedMemory()::shared == '\0') {
        iVar1 = __cxa_guard_acquire(&GetSharedMemory()::shared);
        if (iVar1 != 0) {
          SharedMemoryHandle::SharedMemoryHandle((SharedMemoryHandle *)&GetSharedMemory()::shared);
          __cxa_atexit(SharedMemoryHandle::~SharedMemoryHandle,&GetSharedMemory()::shared,
                       &__dso_handle);
          __cxa_guard_release(&GetSharedMemory()::shared);
        }
      }
      pfVar2 = (float *)((ulong)uVar3 * 0x56248 + GetSharedMemory()::shared + (ulong)(index - 4) * 8
                        );
      pfVar2[1] = 1.4013e-45;
    }
    *pfVar2 = value;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;

        if (index >= P_PARAM1 && index <= P_PARAM4)
        {
            int stream = (int)data->p[P_STREAM];
            assert(stream >= 0);
            assert(stream < Teleport::NUMSTREAMS);

            SharedMemoryHandle& shared = GetSharedMemory();
            Stream& s = shared->streams[stream];

            s.params[index - P_PARAM1].changed = 1;
            s.params[index - P_PARAM1].value = value;
        }
        else
            data->p[index] = value;

        return UNITY_AUDIODSP_OK;
    }